

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O3

uint ON_Locale::EnforcePeriodAsCRuntimeDecimalPoint(void)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = 1;
  bVar1 = PeriodIsCRuntimeDecimalPoint();
  if (!bVar1) {
    uVar2 = 0;
    bVar1 = SetPeriodAsCRuntimeDecimalPoint();
    if (bVar1) {
      bVar1 = PeriodIsCRuntimeDecimalPoint();
      uVar2 = (uint)bVar1 * 2;
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_Locale::EnforcePeriodAsCRuntimeDecimalPoint()
{
  if (true == ON_Locale::PeriodIsCRuntimeDecimalPoint())
    return 1; // decimal point = period;

  if (false == ON_Locale::SetPeriodAsCRuntimeDecimalPoint())
    return 0; // attempt to set decimal point = period failed
  
  if (false == ON_Locale::PeriodIsCRuntimeDecimalPoint())
    return  0; // decimal point != period

  return 2; // decimal point = period
}